

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.cpp
# Opt level: O0

void next_move(Node *root,int depth)

{
  bool bVar1;
  reference root_00;
  __normal_iterator<tNode_**,_std::vector<tNode_*,_std::allocator<tNode_*>_>_> local_38;
  tNode **local_30;
  __normal_iterator<tNode_**,_std::vector<tNode_*,_std::allocator<tNode_*>_>_> local_28;
  iterator it;
  int iStack_18;
  char c;
  int j;
  int i;
  int depth_local;
  Node *root_local;
  
  if (depth < 3) {
    for (iStack_18 = 2; iStack_18 < 10; iStack_18 = iStack_18 + 1) {
      for (it._M_current._4_4_ = 2; it._M_current._4_4_ < 10;
          it._M_current._4_4_ = it._M_current._4_4_ + 1) {
        it._M_current._3_1_ = (*root)->board[iStack_18][it._M_current._4_4_];
        if (((*root)->cur_side & 1U) == 0) {
          switch(it._M_current._3_1_) {
          case 'b':
            bishop(root,iStack_18,it._M_current._4_4_,true);
            break;
          case 'k':
            king(root,iStack_18,it._M_current._4_4_,true);
            break;
          case 'n':
            knight(root,iStack_18,it._M_current._4_4_,true);
            break;
          case 'p':
            pawn(root,iStack_18,it._M_current._4_4_,true);
            break;
          case 'q':
            queen(root,iStack_18,it._M_current._4_4_,true);
            break;
          case 'r':
            rook(root,iStack_18,it._M_current._4_4_,true);
          }
        }
        else {
          switch(it._M_current._3_1_) {
          case 'B':
            bishop(root,iStack_18,it._M_current._4_4_,false);
            break;
          case 'K':
            king(root,iStack_18,it._M_current._4_4_,false);
            break;
          case 'N':
            knight(root,iStack_18,it._M_current._4_4_,false);
            break;
          case 'P':
            pawn(root,iStack_18,it._M_current._4_4_,false);
            break;
          case 'Q':
            queen(root,iStack_18,it._M_current._4_4_,false);
            break;
          case 'R':
            rook(root,iStack_18,it._M_current._4_4_,false);
          }
        }
      }
    }
    __gnu_cxx::__normal_iterator<tNode_**,_std::vector<tNode_*,_std::allocator<tNode_*>_>_>::
    __normal_iterator(&local_28);
    local_30 = (tNode **)std::vector<tNode_*,_std::allocator<tNode_*>_>::begin(&(*root)->next);
    local_28._M_current = local_30;
    while( true ) {
      local_38._M_current =
           (tNode **)std::vector<tNode_*,_std::allocator<tNode_*>_>::end(&(*root)->next);
      bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
      if (!bVar1) break;
      root_00 = __gnu_cxx::
                __normal_iterator<tNode_**,_std::vector<tNode_*,_std::allocator<tNode_*>_>_>::
                operator*(&local_28);
      next_move(root_00,depth + 1);
      __gnu_cxx::__normal_iterator<tNode_**,_std::vector<tNode_*,_std::allocator<tNode_*>_>_>::
      operator++(&local_28,0);
    }
  }
  return;
}

Assistant:

void next_move(Node& root, int depth){
    if(depth >= MAX_DEPTH)
        return;

    int i, j;
    for(i=2; i<10; i++){
        for(j=2; j<10; j++){
            char c = root->board[i][j];

            if(0 == root->cur_side){ // WHITE has moved. Looking for BLACK pieces to move
                switch(c){
                    case 'q': queen(root, i, j, 1); break;
                    case 'r': rook(root, i, j, 1); break;
                    case 'b': bishop(root, i, j, 1); break;
                    case 'n': knight(root, i, j, 1); break;
                    case 'p': pawn(root, i, j, 1); break;
                    case 'k': king(root, i, j, 1); break;
                }
            }
            else{ // BLACK has moved. Looking for WHITE pieces to move.
                switch(c){
                    case 'Q': queen(root, i, j, 0); break;
                    case 'R': rook(root, i, j, 0); break;
                    case 'B': bishop(root, i, j, 0); break;
                    case 'N': knight(root, i, j, 0); break;
                    case 'P': pawn(root, i, j, 0); break;
                    case 'K': king(root, i, j, 0); break;
                }
            }
        }
    }
    // Iterates through each of the generated possibilities
    vector<Node>::iterator it;
    for(it=root->next.begin(); it!=root->next.end(); it++)
        next_move(*it, depth+1);
}